

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O3

int memory_write(mtar_t *tar,void *data,size_t size)

{
  ulong uVar1;
  void *__ptr;
  int iVar2;
  size_t sVar3;
  size_t __size;
  
  iVar2 = -4;
  if (tar->stream == (void *)0x0) {
    if (size != 0) {
      __ptr = tar->memory;
      sVar3 = tar->memory_pos;
      uVar1 = sVar3 + size;
      if (tar->memory_capacity < uVar1) {
        __size = 0x400;
        if (0x400 < uVar1) {
          __size = uVar1 * 2;
        }
        __ptr = realloc(__ptr,__size);
        if (__ptr == (void *)0x0) {
          return -4;
        }
        tar->memory = __ptr;
        tar->memory_size = uVar1;
        tar->memory_capacity = __size;
        sVar3 = tar->memory_pos;
      }
      else if (tar->memory_size < uVar1) {
        tar->memory_size = uVar1;
      }
      else if (__ptr == (void *)0x0) {
        return -4;
      }
      memcpy((void *)(sVar3 + (long)__ptr),data,size);
      tar->memory_pos = tar->memory_pos + size;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int memory_write(mtar_t *tar, const void *data, size_t size) {
  char *memory;
  size_t request_size, new_capacity;

  if (tar->stream)
    return MTAR_EWRITEFAIL;

  if (!size)
    return MTAR_ESUCCESS;

  request_size = tar->memory_pos + size;
  if (request_size > tar->memory_capacity) {
    if (request_size <= 1024)
      new_capacity = 1024;
    else
      new_capacity = request_size * 2;
    memory = (char *)realloc(tar->memory, new_capacity);
    if (!memory) {
      return MTAR_EWRITEFAIL;
    }
    tar->memory = memory;
    tar->memory_size = request_size;
    tar->memory_capacity = new_capacity;
  } else if (request_size > tar->memory_size) {
    memory = (char *)tar->memory;
    tar->memory_size = request_size;
  } else {
    memory = (char *)tar->memory;
    if (!memory) {
      return MTAR_EWRITEFAIL;
    }
  }

  memcpy(&memory[tar->memory_pos], data, size);
  tar->memory_pos += size;

  return MTAR_ESUCCESS;
}